

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_jais::llm_build_jais
          (llm_build_jais *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *this_00;
  pointer plVar2;
  ggml_context *pgVar3;
  uint32_t uVar4;
  llm_graph_input_attn_kv_unified *inp;
  ulong uVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  long lVar10;
  int il;
  long lVar11;
  ggml_tensor *local_60;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this_00 = (this->super_llm_graph_context).hparams;
  uVar1 = this_00->n_embd_head_v;
  uVar4 = llama_hparams::n_embd_v_gqa(this_00,0);
  if (uVar1 == ((this->super_llm_graph_context).hparams)->n_embd_head_k) {
    local_60 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
    inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
    if (0 < (this->super_llm_graph_context).n_layer) {
      uVar5 = (ulong)uVar4;
      lVar10 = 0;
      lVar11 = 0;
      do {
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        il = (int)lVar11;
        pgVar6 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,local_60,
                            *(ggml_tensor **)((long)&plVar2->attn_norm + lVar10),
                            *(ggml_tensor **)((long)&plVar2->attn_norm_b + lVar10),LLM_NORM,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il);
        pgVar6 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wqkv + lVar10),
                            pgVar6);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"wqkv",il);
        pgVar6 = (ggml_tensor *)
                 ggml_add((this->super_llm_graph_context).ctx0,pgVar6,
                          *(undefined8 *)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->bqkv + lVar10));
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"bqkv",il);
        pgVar3 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar3,pgVar6,(this->super_llm_graph_context).n_embd,
                             (long)(this->super_llm_graph_context).n_tokens,pgVar6->nb[1],0);
        pgVar8 = (ggml_tensor *)ggml_cont(pgVar3,uVar7);
        pgVar3 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar3,pgVar6,uVar5,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar6->nb[1],(this->super_llm_graph_context).n_embd * pgVar6->nb[0]);
        pgVar9 = (ggml_tensor *)ggml_cont(pgVar3,uVar7);
        pgVar3 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar3,pgVar6,uVar5,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar6->nb[1],
                             ((this->super_llm_graph_context).n_embd + uVar5) * pgVar6->nb[0]);
        pgVar6 = (ggml_tensor *)ggml_cont(pgVar3,uVar7);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
        pgVar8 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                                 (this->super_llm_graph_context).n_head,
                                 (long)(this->super_llm_graph_context).n_tokens);
        pgVar9 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar9,uVar1,
                                 (this->super_llm_graph_context).n_head_kv,
                                 (long)(this->super_llm_graph_context).n_tokens);
        pgVar6 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                                 (this->super_llm_graph_context).n_head_kv,
                                 (long)(this->super_llm_graph_context).n_tokens);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar6 = llm_graph_context::build_attn
                           (&this->super_llm_graph_context,inp,gf,
                            *(ggml_tensor **)((long)&plVar2->wo + lVar10),
                            *(ggml_tensor **)((long)&plVar2->bo + lVar10),pgVar8,pgVar9,pgVar6,
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / (float)uVar1,il);
        if (lVar11 == (this->super_llm_graph_context).n_layer + -1) {
          pgVar8 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
          pgVar6 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar6,pgVar8);
          local_60 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,local_60,pgVar8);
        }
        pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,local_60);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_inp",il);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar8 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,pgVar6,
                            *(ggml_tensor **)((long)&plVar2->ffn_norm + lVar10),
                            *(ggml_tensor **)((long)&plVar2->ffn_norm_b + lVar10),LLM_NORM,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_norm",il);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar8 = llm_graph_context::build_ffn
                           (&this->super_llm_graph_context,pgVar8,
                            *(ggml_tensor **)((long)&plVar2->ffn_up + lVar10),
                            *(ggml_tensor **)((long)&plVar2->ffn_up_b + lVar10),(ggml_tensor *)0x0,
                            *(ggml_tensor **)((long)&plVar2->ffn_gate + lVar10),
                            *(ggml_tensor **)((long)&plVar2->ffn_gate_b + lVar10),(ggml_tensor *)0x0
                            ,*(ggml_tensor **)((long)&plVar2->ffn_down + lVar10),
                            *(ggml_tensor **)((long)&plVar2->ffn_down_b + lVar10),(ggml_tensor *)0x0
                            ,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_out",il);
        local_60 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,pgVar6);
        llm_graph_context::cb(&this->super_llm_graph_context,local_60,"l_out",il);
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x4f0;
      } while (lVar11 < (this->super_llm_graph_context).n_layer);
    }
    pgVar6 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_60,model->output_norm,
                        model->output_norm_b,LLM_NORM,-1);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_norm",-1);
    ((this->super_llm_graph_context).res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar6;
    pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar6);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_output",-1);
    ((this->super_llm_graph_context).res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar6;
    ggml_build_forward_expand(gf,pgVar6);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x29ee,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
}

Assistant:

llm_build_jais(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*cur->nb[0]*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*cur->nb[0]*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*cur->nb[0]*(n_embd + n_embd_gqa)));

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/float(n_embd_head), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        model.layers[il].ffn_gate, model.layers[il].ffn_gate_b, NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            inpL = ggml_add(ctx0, cur, ffn_inp);
            cb(inpL, "l_out", il);
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }